

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall
jessilib::callback_with_iterations::operator()(callback_with_iterations *this,timer *in_timer)

{
  __int_type _Var1;
  __int_type _Var2;
  bool bVar3;
  cancel_detector detector;
  cancel_detector cStack_18;
  
  cancel_detector::cancel_detector(&cStack_18,&this->m_cancel_token);
  _Var1 = (this->m_iterations).super___atomic_base<unsigned_long>._M_i;
  do {
    if (_Var1 == 0) goto LAB_00187313;
    LOCK();
    _Var2 = (this->m_iterations).super___atomic_base<unsigned_long>._M_i;
    bVar3 = _Var1 == _Var2;
    if (bVar3) {
      (this->m_iterations).super___atomic_base<unsigned_long>._M_i = _Var1 - 1;
      _Var2 = _Var1;
    }
    UNLOCK();
    _Var1 = _Var2;
  } while (!bVar3);
  std::function<void_(jessilib::timer_&)>::operator()(&this->m_callback,in_timer);
  bVar3 = cancel_detector::expired(&cStack_18);
  if ((!bVar3) && ((this->m_iterations).super___atomic_base<unsigned_long>._M_i == 0)) {
    timer::cancel(in_timer);
  }
LAB_00187313:
  cancel_detector::~cancel_detector(&cStack_18);
  return;
}

Assistant:

void operator()(timer& in_timer) {
		cancel_detector detector{ m_cancel_token };

		auto iterations = m_iterations.load();
		do {
			// Ensure timer is not already expired
			if (iterations == 0) {
				return;
			}

			// Decrement iterations and cancel if necessary
		} while (!m_iterations.compare_exchange_weak(iterations, iterations - 1));

		// Call callback
		m_callback(in_timer);

		if (!detector.expired()) {
			if (m_iterations == 0) {
				// Cancel the timer
				in_timer.cancel();
			}
		}
	}